

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_CINDEX(TT_ExecContext exc,FT_Long *args)

{
  long lVar1;
  FT_Long L;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  lVar1 = *args;
  if ((lVar1 < 1) || (exc->args < lVar1)) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
    *args = 0;
  }
  else {
    *args = exc->stack[exc->args - lVar1];
  }
  return;
}

Assistant:

static void
  Ins_CINDEX( TT_ExecContext  exc,
              FT_Long*        args )
  {
    FT_Long  L;


    L = args[0];

    if ( L <= 0 || L > exc->args )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      args[0] = 0;
    }
    else
      args[0] = exc->stack[exc->args - L];
  }